

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int moveto_node(lyxp_set *set,lyd_node *cur_node,char *qname,uint16_t qname_len,int options)

{
  lyd_node *plVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  lyxp_node_type node_type;
  uint32_t uVar5;
  int in_R9D;
  bool bVar6;
  ly_ctx *ctx;
  uint uVar7;
  lyxp_set *plVar8;
  lyxp_set_node *plVar9;
  lyd_node **pplVar10;
  lyxp_node_type local_54;
  ly_ctx *plStack_50;
  lyxp_node_type root_type;
  lys_module *local_48;
  uint32_t local_3c;
  lyxp_set *local_38;
  
  uVar4 = (ulong)qname_len;
  if (set == (lyxp_set *)0x0) {
    return 0;
  }
  if (set->type == LYXP_SET_EMPTY) {
    return 0;
  }
  local_3c = options;
  if (cur_node == (lyd_node *)0x0) {
    __assert_fail("cur_node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                  ,0x151f,
                  "int moveto_node(struct lyxp_set *, struct lyd_node *, const char *, uint16_t, int)"
                 );
  }
  ctx = cur_node->schema->module->ctx;
  if (set->type == LYXP_SET_NODE_SET) {
    local_38 = set;
    moveto_get_root(cur_node,options,&local_54);
    pcVar3 = strnchr(qname,0x3a,(uint)qname_len);
    if (pcVar3 == (char *)0x0) {
      if ((qname_len == 1) && (*qname == '*')) {
        local_48 = (lys_module *)0x0;
        uVar4 = 1;
      }
      else {
        local_48 = lyd_node_module(cur_node);
      }
    }
    else {
      uVar7 = (int)pcVar3 - (int)qname;
      local_48 = moveto_resolve_model(qname,(uint16_t)uVar7,ctx,(lys_node *)0x0,0,in_R9D);
      if (local_48 == (lys_module *)0x0) {
        ly_vlog(ctx,LYE_XPATH_INMOD,LY_VLOG_NONE,(void *)0x0,(ulong)uVar7,qname);
        goto LAB_00176b3a;
      }
      qname = qname + (long)(int)uVar7 + 1;
      uVar4 = (ulong)(~uVar7 + (uint)qname_len);
    }
    pcVar3 = lydict_insert(ctx,qname,uVar4 & 0xffff);
    node_type = LYXP_NODE_ROOT;
    plVar8 = local_38;
    plStack_50 = ctx;
    while (node_type < plVar8->used) {
      plVar9 = (plVar8->val).nodes + node_type;
      if (LYXP_NODE_ROOT_CONFIG < (plVar8->val).nodes[node_type].type) {
        plVar1 = plVar9->node;
        if ((-1 < (char)plVar1->validity) &&
           ((plVar1->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN)) {
          bVar6 = false;
          pplVar10 = &plVar1->child;
          while (plVar1 = *pplVar10, plVar1 != (lyd_node *)0x0) {
            uVar5 = local_3c;
            iVar2 = moveto_node_check(plVar1,local_54,pcVar3,local_48,local_3c);
            if (iVar2 == 0) {
              if (bVar6) {
                set_insert_node(local_38,plVar1,0,LYXP_NODE_ELEM,node_type);
              }
              else {
                set_replace_node(local_38,plVar1,2,node_type,uVar5);
              }
              node_type = node_type + LYXP_NODE_ROOT_CONFIG;
              bVar6 = true;
            }
            else if (iVar2 == 1) goto LAB_00176cd0;
            pplVar10 = &plVar1->next;
          }
          goto LAB_00176cb0;
        }
        goto LAB_00176cc1;
      }
      bVar6 = false;
      while (plVar1 = plVar9->node, plVar1 != (lyd_node *)0x0) {
        uVar5 = local_3c;
        iVar2 = moveto_node_check(plVar1,local_54,pcVar3,local_48,local_3c);
        if (iVar2 == 0) {
          if (bVar6) {
            set_insert_node(local_38,plVar1,0,LYXP_NODE_ELEM,node_type);
          }
          else {
            set_replace_node(local_38,plVar1,2,node_type,uVar5);
          }
          node_type = node_type + LYXP_NODE_ROOT_CONFIG;
          bVar6 = true;
        }
        else if (iVar2 == 1) {
LAB_00176cd0:
          lydict_remove(plStack_50,pcVar3);
          return 1;
        }
        plVar9 = (lyxp_set_node *)&plVar1->next;
      }
LAB_00176cb0:
      ctx = plStack_50;
      plVar8 = local_38;
      if (!bVar6) {
LAB_00176cc1:
        plVar8 = local_38;
        set_remove_node(local_38,node_type);
      }
    }
    lydict_remove(ctx,pcVar3);
    iVar2 = 0;
  }
  else {
    pcVar3 = print_set_type(set);
    ly_vlog(ctx,LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar3);
LAB_00176b3a:
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int
moveto_node(struct lyxp_set *set, struct lyd_node *cur_node, const char *qname, uint16_t qname_len, int options)
{
    uint32_t i;
    int replaced, pref_len, ret;
    const char *ptr, *name_dict = NULL; /* optimalization - so we can do (==) instead (!strncmp(...)) in moveto_node_check() */
    struct lys_module *moveto_mod;
    struct lyd_node *sub;
    struct ly_ctx *ctx;
    enum lyxp_node_type root_type;

    if (!set || (set->type == LYXP_SET_EMPTY)) {
        return EXIT_SUCCESS;
    }

    assert(cur_node);
    ctx = cur_node->schema->module->ctx;

    if (set->type != LYXP_SET_NODE_SET) {
        LOGVAL(ctx, LYE_XPATH_INOP_1, LY_VLOG_NONE, NULL, "path operator", print_set_type(set));
        return -1;
    }

    moveto_get_root(cur_node, options, &root_type);

    /* prefix */
    if ((ptr = strnchr(qname, ':', qname_len))) {
        /* specific module */
        pref_len = ptr - qname;
        moveto_mod = moveto_resolve_model(qname, pref_len, ctx, NULL, 1, 0);
        if (!moveto_mod) {
            LOGVAL(ctx, LYE_XPATH_INMOD, LY_VLOG_NONE, NULL, pref_len, qname);
            return -1;
        }
        qname += pref_len + 1;
        qname_len -= pref_len + 1;
    } else if ((qname[0] == '*') && (qname_len == 1)) {
        /* all modules - special case */
        moveto_mod = NULL;
    } else {
        /* content node module */
        moveto_mod = lyd_node_module(cur_node);
    }

    /* name */
    name_dict = lydict_insert(ctx, qname, qname_len);

    for (i = 0; i < set->used; ) {
        replaced = 0;

        if ((set->val.nodes[i].type == LYXP_NODE_ROOT_CONFIG) || (set->val.nodes[i].type == LYXP_NODE_ROOT)) {
            LY_TREE_FOR(set->val.nodes[i].node, sub) {
                ret = moveto_node_check(sub, root_type, name_dict, moveto_mod, options);
                if (!ret) {
                    /* pos filled later */
                    if (!replaced) {
                        set_replace_node(set, sub, 0, LYXP_NODE_ELEM, i);
                        replaced = 1;
                    } else {
                        set_insert_node(set, sub, 0, LYXP_NODE_ELEM, i);
                    }
                    ++i;
                } else if (ret == EXIT_FAILURE) {
                    lydict_remove(ctx, name_dict);
                    return EXIT_FAILURE;
                }
            }

        /* skip nodes without children - leaves, leaflists, anyxmls, and dummy nodes (ouput root will eval to true) */
        } else if (!(set->val.nodes[i].node->validity & LYD_VAL_INUSE)
                && !(set->val.nodes[i].node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA))) {

            LY_TREE_FOR(set->val.nodes[i].node->child, sub) {
                ret = moveto_node_check(sub, root_type, name_dict, moveto_mod, options);
                if (!ret) {
                    if (!replaced) {
                        set_replace_node(set, sub, 0, LYXP_NODE_ELEM, i);
                        replaced = 1;
                    } else {
                        set_insert_node(set, sub, 0, LYXP_NODE_ELEM, i);
                    }
                    ++i;
                } else if (ret == EXIT_FAILURE) {
                    lydict_remove(ctx, name_dict);
                    return EXIT_FAILURE;
                }
            }
        }

        if (!replaced) {
            /* no match */
            set_remove_node(set, i);
        }
    }
    lydict_remove(ctx, name_dict);

    return EXIT_SUCCESS;
}